

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O1

void __thiscall
features::NearestNeighbor<float>::find(NearestNeighbor<float> *this,float *query,Result *result)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  ulong uVar6;
  int *piVar7;
  Result *pRVar8;
  float fVar9;
  float fVar10;
  
  result->dist_1st_best = 0.0;
  result->dist_2nd_best = 0.0;
  result->index_1st_best = 0;
  result->index_2nd_best = 0;
  iVar2 = this->num_elements;
  if (0 < iVar2) {
    uVar3 = this->dimensions;
    pfVar5 = this->elements;
    iVar4 = 0;
    fVar9 = 0.0;
    do {
      fVar10 = 0.0;
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          fVar10 = fVar10 + query[uVar6] * pfVar5[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
        pfVar5 = pfVar5 + uVar3;
      }
      if (fVar9 <= fVar10) {
        fVar1 = result->dist_1st_best;
        piVar7 = &result->index_2nd_best;
        pRVar8 = (Result *)&result->dist_2nd_best;
        fVar9 = fVar10;
        if (fVar1 <= fVar10) {
          result->index_2nd_best = result->index_1st_best;
          result->dist_2nd_best = fVar1;
          piVar7 = &result->index_1st_best;
          pRVar8 = result;
          fVar9 = fVar1;
        }
        *piVar7 = iVar4;
        pRVar8->dist_1st_best = fVar10;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2);
  }
  fVar9 = 2.0 - (result->dist_1st_best + result->dist_1st_best);
  if (fVar9 <= 0.0) {
    fVar9 = 0.0;
  }
  result->dist_1st_best = fVar9;
  fVar9 = 2.0 - (result->dist_2nd_best + result->dist_2nd_best);
  if (fVar9 <= 0.0) {
    fVar9 = 0.0;
  }
  result->dist_2nd_best = fVar9;
  return;
}

Assistant:

void
NearestNeighbor<float>::find (float const* query,
    NearestNeighbor<float>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0.0f;
    result->dist_2nd_best = 0.0f;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    float_inner_prod(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual (square) distances.
     */
    result->dist_1st_best = std::max(0.0f, 2.0f - 2.0f * result->dist_1st_best);
    result->dist_2nd_best = std::max(0.0f, 2.0f - 2.0f * result->dist_2nd_best);
}